

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O1

void i_string_suite::i_string_1st_valid_surrogate_2nd_invalid(void)

{
  char input [17];
  reader reader;
  undefined4 local_18c;
  view_type local_188;
  char local_178 [32];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_178,"[\"\\uD888\\u1234\"]",0x11);
  local_188._M_len = strlen(local_178);
  local_188._M_str = local_178;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_188);
  local_18c = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xbe,"void i_string_suite::i_string_1st_valid_surrogate_2nd_invalid()",&local_188,
             &local_18c);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_188._M_len = CONCAT44(local_188._M_len._4_4_,local_158.decoder.current.code);
  local_18c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xc0,"void i_string_suite::i_string_1st_valid_surrogate_2nd_invalid()",&local_188,
             &local_18c);
  local_188._M_len =
       (long)local_158.decoder.current.view.tail - (long)local_158.decoder.current.view.head;
  local_188._M_str = local_158.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[15]>
            ("reader.literal()","\"\\\"\\\\uD888\\\\u1234\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xc1,"void i_string_suite::i_string_1st_valid_surrogate_2nd_invalid()",&local_188,
             "\"\\uD888\\u1234\"");
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_188._M_len = CONCAT44(local_188._M_len._4_4_,local_158.decoder.current.code);
  local_18c = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xc3,"void i_string_suite::i_string_1st_valid_surrogate_2nd_invalid()",&local_188,
             &local_18c);
  if (local_158.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void i_string_1st_valid_surrogate_2nd_invalid()
{
    const char input[] = "[\"\\uD888\\u1234\"]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "\"\\uD888\\u1234\""); // No knowledge of surrogates
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
}